

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O2

bool embree::avx::SphereMiMBIntersectorK<8,_4,_true>::occluded
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *sphere)

{
  float fVar1;
  uint uVar2;
  Geometry *pGVar3;
  long lVar4;
  long lVar5;
  RTCFilterFunctionN p_Var6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  long lVar19;
  byte bVar20;
  ulong uVar21;
  ulong uVar22;
  Scene *pSVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  bool bVar27;
  ulong uVar28;
  undefined4 uVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar48;
  float fVar49;
  float fVar51;
  float fVar52;
  float fVar53;
  undefined1 auVar45 [32];
  float fVar50;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  float fVar54;
  undefined1 auVar55 [16];
  float fVar63;
  float fVar64;
  float fVar66;
  float fVar67;
  float fVar68;
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  float fVar65;
  float fVar69;
  undefined1 auVar61 [32];
  undefined1 auVar62 [64];
  undefined1 auVar70 [36];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [64];
  undefined1 auVar74 [36];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [64];
  undefined1 auVar85 [32];
  undefined1 auVar86 [64];
  undefined1 auVar88 [32];
  undefined1 auVar87 [32];
  undefined1 auVar89 [64];
  undefined1 auVar90 [28];
  undefined1 auVar91 [32];
  undefined1 auVar92 [64];
  undefined1 auVar93 [28];
  undefined1 auVar94 [64];
  undefined1 auVar95 [32];
  undefined1 auVar97 [28];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [28];
  undefined1 auVar101 [64];
  undefined1 auVar102 [32];
  undefined1 auVar103 [64];
  RTCFilterFunctionNArguments args;
  SphereIntersectorHitM<8> hit;
  undefined1 local_360 [16];
  Scene *local_348;
  Primitive *local_340;
  RayK<4> *local_338;
  RTCFilterFunctionNArguments local_330;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [32];
  uint local_260;
  uint uStack_25c;
  uint uStack_258;
  uint uStack_254;
  undefined1 local_250 [16];
  uint local_240;
  uint uStack_23c;
  uint uStack_238;
  uint uStack_234;
  uint uStack_230;
  uint uStack_22c;
  uint uStack_228;
  uint uStack_224;
  undefined1 local_220 [16];
  undefined1 local_210 [16];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar81 [64];
  undefined1 auVar96 [64];
  
  pSVar23 = context->scene;
  uVar2 = sphere->sharedGeomID;
  pGVar3 = (pSVar23->geometries).items[uVar2].ptr;
  fVar1 = (pGVar3->time_range).lower;
  fVar1 = pGVar3->fnumTimeSegments *
          ((*(float *)(ray + k * 4 + 0x70) - fVar1) / ((pGVar3->time_range).upper - fVar1));
  auVar55 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
  auVar55 = vminss_avx(auVar55,ZEXT416((uint)(pGVar3->fnumTimeSegments + -1.0)));
  auVar55 = vmaxss_avx(ZEXT816(0) << 0x20,auVar55);
  uVar21 = (ulong)(sphere->primIDs).field_0.i[0];
  lVar4 = *(long *)&pGVar3[2].numPrimitives;
  lVar19 = (long)(int)auVar55._0_4_ * 0x38;
  lVar5 = *(long *)(lVar4 + lVar19);
  lVar31 = *(long *)(lVar4 + 0x10 + lVar19);
  uVar24 = (ulong)(sphere->primIDs).field_0.i[1];
  uVar25 = (ulong)(sphere->primIDs).field_0.i[2];
  uVar32 = (ulong)(sphere->primIDs).field_0.i[3];
  uVar22 = (ulong)(sphere->primIDs).field_0.i[4];
  auVar56._16_16_ = *(undefined1 (*) [16])(lVar5 + lVar31 * uVar22);
  auVar56._0_16_ = *(undefined1 (*) [16])(lVar5 + lVar31 * uVar21);
  uVar30 = (ulong)(sphere->primIDs).field_0.i[5];
  auVar71._16_16_ = *(undefined1 (*) [16])(lVar5 + lVar31 * uVar30);
  auVar71._0_16_ = *(undefined1 (*) [16])(lVar5 + lVar31 * uVar24);
  uVar26 = (ulong)(sphere->primIDs).field_0.i[6];
  auVar75._16_16_ = *(undefined1 (*) [16])(lVar5 + lVar31 * uVar26);
  auVar75._0_16_ = *(undefined1 (*) [16])(lVar5 + lVar31 * uVar25);
  uVar28 = (ulong)(sphere->primIDs).field_0.i[7];
  auVar77._16_16_ = *(undefined1 (*) [16])(lVar5 + lVar31 * uVar28);
  auVar77._0_16_ = *(undefined1 (*) [16])(lVar5 + lVar31 * uVar32);
  lVar5 = *(long *)(lVar4 + 0x38 + lVar19);
  lVar4 = *(long *)(lVar4 + 0x48 + lVar19);
  auVar82._16_16_ = *(undefined1 (*) [16])(lVar5 + uVar22 * lVar4);
  auVar82._0_16_ = *(undefined1 (*) [16])(lVar5 + uVar21 * lVar4);
  lVar31 = uVar30 * lVar4;
  auVar85._16_16_ = *(undefined1 (*) [16])(lVar5 + lVar31);
  auVar85._0_16_ = *(undefined1 (*) [16])(lVar5 + uVar24 * lVar4);
  auVar87._16_16_ = *(undefined1 (*) [16])(lVar5 + uVar26 * lVar4);
  auVar87._0_16_ = *(undefined1 (*) [16])(lVar5 + uVar25 * lVar4);
  auVar91._16_16_ = *(undefined1 (*) [16])(lVar5 + lVar4 * uVar28);
  auVar91._0_16_ = *(undefined1 (*) [16])(lVar5 + uVar32 * lVar4);
  fVar1 = fVar1 - auVar55._0_4_;
  auVar57 = vunpcklps_avx(auVar56,auVar75);
  auVar88 = vunpckhps_avx(auVar56,auVar75);
  auVar58 = vunpcklps_avx(auVar71,auVar77);
  auVar56 = vunpckhps_avx(auVar71,auVar77);
  auVar10 = vunpcklps_avx(auVar57,auVar58);
  auVar57 = vunpckhps_avx(auVar57,auVar58);
  auVar11 = vunpcklps_avx(auVar88,auVar56);
  auVar88 = vunpckhps_avx(auVar88,auVar56);
  auVar102 = vunpcklps_avx(auVar82,auVar87);
  auVar56 = vunpckhps_avx(auVar82,auVar87);
  auVar71 = vunpcklps_avx(auVar85,auVar91);
  auVar58 = vunpckhps_avx(auVar85,auVar91);
  auVar12 = vunpcklps_avx(auVar102,auVar71);
  auVar102 = vunpckhps_avx(auVar102,auVar71);
  auVar13 = vunpcklps_avx(auVar56,auVar58);
  auVar71 = vunpckhps_avx(auVar56,auVar58);
  auVar55 = vshufps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0);
  auVar43 = vshufps_avx(ZEXT416((uint)(1.0 - fVar1)),ZEXT416((uint)(1.0 - fVar1)),0);
  auVar45._8_4_ = 0x3f800000;
  auVar45._0_8_ = 0x3f8000003f800000;
  auVar45._12_4_ = 0x3f800000;
  auVar45._16_4_ = 0x3f800000;
  auVar45._20_4_ = 0x3f800000;
  auVar45._24_4_ = 0x3f800000;
  auVar45._28_4_ = 0x3f800000;
  fVar1 = auVar55._0_4_;
  fVar7 = auVar55._4_4_;
  fVar8 = auVar55._8_4_;
  fVar9 = auVar55._12_4_;
  fVar54 = auVar43._0_4_;
  fVar34 = auVar43._4_4_;
  fVar41 = auVar43._8_4_;
  fVar37 = auVar43._12_4_;
  auVar78._0_4_ = auVar12._0_4_ * fVar1 + fVar54 * auVar10._0_4_;
  auVar78._4_4_ = auVar12._4_4_ * fVar7 + fVar34 * auVar10._4_4_;
  auVar78._8_4_ = auVar12._8_4_ * fVar8 + fVar41 * auVar10._8_4_;
  auVar78._12_4_ = auVar12._12_4_ * fVar9 + fVar37 * auVar10._12_4_;
  auVar78._16_4_ = auVar12._16_4_ * fVar1 + fVar54 * auVar10._16_4_;
  auVar78._20_4_ = auVar12._20_4_ * fVar7 + fVar34 * auVar10._20_4_;
  auVar78._24_4_ = auVar12._24_4_ * fVar8 + fVar41 * auVar10._24_4_;
  auVar78._28_4_ = auVar12._28_4_ + auVar10._28_4_;
  auVar76._0_4_ = fVar54 * auVar57._0_4_ + fVar1 * auVar102._0_4_;
  auVar76._4_4_ = fVar34 * auVar57._4_4_ + fVar7 * auVar102._4_4_;
  auVar76._8_4_ = fVar41 * auVar57._8_4_ + fVar8 * auVar102._8_4_;
  auVar76._12_4_ = fVar37 * auVar57._12_4_ + fVar9 * auVar102._12_4_;
  auVar76._16_4_ = fVar54 * auVar57._16_4_ + fVar1 * auVar102._16_4_;
  auVar76._20_4_ = fVar34 * auVar57._20_4_ + fVar7 * auVar102._20_4_;
  auVar76._24_4_ = fVar41 * auVar57._24_4_ + fVar8 * auVar102._24_4_;
  auVar76._28_4_ = auVar57._28_4_ + auVar102._28_4_;
  auVar83._0_4_ = auVar13._0_4_ * fVar1 + auVar11._0_4_ * fVar54;
  auVar83._4_4_ = auVar13._4_4_ * fVar7 + auVar11._4_4_ * fVar34;
  auVar83._8_4_ = auVar13._8_4_ * fVar8 + auVar11._8_4_ * fVar41;
  auVar83._12_4_ = auVar13._12_4_ * fVar9 + auVar11._12_4_ * fVar37;
  auVar83._16_4_ = auVar13._16_4_ * fVar1 + auVar11._16_4_ * fVar54;
  auVar83._20_4_ = auVar13._20_4_ * fVar7 + auVar11._20_4_ * fVar34;
  auVar83._24_4_ = auVar13._24_4_ * fVar8 + auVar11._24_4_ * fVar41;
  auVar83._28_4_ = auVar13._28_4_ + auVar102._28_4_;
  fVar33 = fVar54 * auVar88._0_4_ + fVar1 * auVar71._0_4_;
  fVar35 = fVar34 * auVar88._4_4_ + fVar7 * auVar71._4_4_;
  fVar36 = fVar41 * auVar88._8_4_ + fVar8 * auVar71._8_4_;
  fVar38 = fVar37 * auVar88._12_4_ + fVar9 * auVar71._12_4_;
  fVar39 = fVar54 * auVar88._16_4_ + fVar1 * auVar71._16_4_;
  fVar40 = fVar34 * auVar88._20_4_ + fVar7 * auVar71._20_4_;
  fVar41 = fVar41 * auVar88._24_4_ + fVar8 * auVar71._24_4_;
  local_210 = vshufps_avx(ZEXT416(uVar2),ZEXT416(uVar2),0);
  local_220 = local_210;
  uVar29 = *(undefined4 *)(ray + k * 4);
  auVar57._4_4_ = uVar29;
  auVar57._0_4_ = uVar29;
  auVar57._8_4_ = uVar29;
  auVar57._12_4_ = uVar29;
  auVar57._16_4_ = uVar29;
  auVar57._20_4_ = uVar29;
  auVar57._24_4_ = uVar29;
  auVar57._28_4_ = uVar29;
  auVar56 = vsubps_avx(auVar78,auVar57);
  uVar29 = *(undefined4 *)(ray + k * 4 + 0x10);
  auVar58._4_4_ = uVar29;
  auVar58._0_4_ = uVar29;
  auVar58._8_4_ = uVar29;
  auVar58._12_4_ = uVar29;
  auVar58._16_4_ = uVar29;
  auVar58._20_4_ = uVar29;
  auVar58._24_4_ = uVar29;
  auVar58._28_4_ = uVar29;
  auVar57 = vsubps_avx(auVar76,auVar58);
  uVar29 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar59._4_4_ = uVar29;
  auVar59._0_4_ = uVar29;
  auVar59._8_4_ = uVar29;
  auVar59._12_4_ = uVar29;
  auVar59._16_4_ = uVar29;
  auVar59._20_4_ = uVar29;
  auVar59._24_4_ = uVar29;
  auVar59._28_4_ = uVar29;
  fVar1 = *(float *)(ray + k * 4 + 0x40);
  auVar92 = ZEXT3264(CONCAT428(fVar1,CONCAT424(fVar1,CONCAT420(fVar1,CONCAT416(fVar1,CONCAT412(fVar1
                                                  ,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))))))));
  fVar7 = *(float *)(ray + k * 4 + 0x50);
  auVar94 = ZEXT3264(CONCAT428(fVar7,CONCAT424(fVar7,CONCAT420(fVar7,CONCAT416(fVar7,CONCAT412(fVar7
                                                  ,CONCAT48(fVar7,CONCAT44(fVar7,fVar7))))))));
  fVar8 = *(float *)(ray + k * 4 + 0x60);
  auVar98 = ZEXT3264(CONCAT428(fVar8,CONCAT424(fVar8,CONCAT420(fVar8,CONCAT416(fVar8,CONCAT412(fVar8
                                                  ,CONCAT48(fVar8,CONCAT44(fVar8,fVar8))))))));
  auVar58 = vsubps_avx(auVar83,auVar59);
  auVar55 = ZEXT416((uint)(fVar1 * fVar1 + fVar7 * fVar7 + fVar8 * fVar8));
  auVar55 = vshufps_avx(auVar55,auVar55,0);
  auVar60._16_16_ = auVar55;
  auVar60._0_16_ = auVar55;
  auVar88 = vrcpps_avx(auVar60);
  fVar42 = auVar88._0_4_;
  fVar48 = auVar88._4_4_;
  auVar102._4_4_ = fVar48 * auVar55._4_4_;
  auVar102._0_4_ = fVar42 * auVar55._0_4_;
  fVar49 = auVar88._8_4_;
  auVar102._8_4_ = fVar49 * auVar55._8_4_;
  fVar54 = auVar55._12_4_;
  fVar50 = auVar88._12_4_;
  auVar102._12_4_ = fVar50 * fVar54;
  fVar51 = auVar88._16_4_;
  auVar102._16_4_ = fVar51 * auVar55._0_4_;
  fVar52 = auVar88._20_4_;
  auVar102._20_4_ = fVar52 * auVar55._4_4_;
  fVar53 = auVar88._24_4_;
  auVar102._24_4_ = fVar53 * auVar55._8_4_;
  auVar102._28_4_ = fVar54;
  auVar102 = vsubps_avx(auVar45,auVar102);
  fVar42 = fVar42 + fVar42 * auVar102._0_4_;
  fVar48 = fVar48 + fVar48 * auVar102._4_4_;
  fVar49 = fVar49 + fVar49 * auVar102._8_4_;
  fVar50 = fVar50 + fVar50 * auVar102._12_4_;
  fVar51 = fVar51 + fVar51 * auVar102._16_4_;
  fVar52 = fVar52 + fVar52 * auVar102._20_4_;
  fVar53 = fVar53 + fVar53 * auVar102._24_4_;
  fVar34 = auVar88._28_4_;
  fVar69 = fVar34 + fVar34 + fVar54;
  fVar54 = (fVar1 * auVar56._0_4_ + fVar7 * auVar57._0_4_ + fVar8 * auVar58._0_4_) * fVar42;
  fVar63 = (fVar1 * auVar56._4_4_ + fVar7 * auVar57._4_4_ + fVar8 * auVar58._4_4_) * fVar48;
  auVar11._4_4_ = fVar63;
  auVar11._0_4_ = fVar54;
  fVar64 = (fVar1 * auVar56._8_4_ + fVar7 * auVar57._8_4_ + fVar8 * auVar58._8_4_) * fVar49;
  auVar11._8_4_ = fVar64;
  fVar65 = (fVar1 * auVar56._12_4_ + fVar7 * auVar57._12_4_ + fVar8 * auVar58._12_4_) * fVar50;
  auVar11._12_4_ = fVar65;
  fVar66 = (fVar1 * auVar56._16_4_ + fVar7 * auVar57._16_4_ + fVar8 * auVar58._16_4_) * fVar51;
  auVar11._16_4_ = fVar66;
  fVar67 = (fVar1 * auVar56._20_4_ + fVar7 * auVar57._20_4_ + fVar8 * auVar58._20_4_) * fVar52;
  auVar11._20_4_ = fVar67;
  fVar68 = (fVar1 * auVar56._24_4_ + fVar7 * auVar57._24_4_ + fVar8 * auVar58._24_4_) * fVar53;
  auVar11._24_4_ = fVar68;
  auVar11._28_4_ = fVar69;
  auVar88._4_4_ = fVar1 * fVar63;
  auVar88._0_4_ = fVar1 * fVar54;
  auVar88._8_4_ = fVar1 * fVar64;
  auVar88._12_4_ = fVar1 * fVar65;
  auVar88._16_4_ = fVar1 * fVar66;
  auVar88._20_4_ = fVar1 * fVar67;
  auVar88._24_4_ = fVar1 * fVar68;
  auVar88._28_4_ = fVar34;
  auVar10._4_4_ = fVar7 * fVar63;
  auVar10._0_4_ = fVar7 * fVar54;
  auVar10._8_4_ = fVar7 * fVar64;
  auVar10._12_4_ = fVar7 * fVar65;
  auVar10._16_4_ = fVar7 * fVar66;
  auVar10._20_4_ = fVar7 * fVar67;
  auVar10._24_4_ = fVar7 * fVar68;
  auVar10._28_4_ = fVar9;
  auVar13._4_4_ = fVar8 * fVar63;
  auVar13._0_4_ = fVar8 * fVar54;
  auVar13._8_4_ = fVar8 * fVar64;
  auVar13._12_4_ = fVar8 * fVar65;
  auVar13._16_4_ = fVar8 * fVar66;
  auVar13._20_4_ = fVar8 * fVar67;
  auVar13._24_4_ = fVar8 * fVar68;
  auVar13._28_4_ = auVar12._28_4_;
  auVar102 = vsubps_avx(auVar56,auVar88);
  auVar99 = ZEXT3264(auVar102);
  auVar10 = vsubps_avx(auVar57,auVar10);
  auVar86 = ZEXT3264(auVar10);
  auVar58 = vsubps_avx(auVar58,auVar13);
  auVar89 = ZEXT3264(auVar58);
  auVar72._0_4_ =
       auVar102._0_4_ * auVar102._0_4_ +
       auVar10._0_4_ * auVar10._0_4_ + auVar58._0_4_ * auVar58._0_4_;
  auVar72._4_4_ =
       auVar102._4_4_ * auVar102._4_4_ +
       auVar10._4_4_ * auVar10._4_4_ + auVar58._4_4_ * auVar58._4_4_;
  auVar72._8_4_ =
       auVar102._8_4_ * auVar102._8_4_ +
       auVar10._8_4_ * auVar10._8_4_ + auVar58._8_4_ * auVar58._8_4_;
  auVar72._12_4_ =
       auVar102._12_4_ * auVar102._12_4_ +
       auVar10._12_4_ * auVar10._12_4_ + auVar58._12_4_ * auVar58._12_4_;
  auVar72._16_4_ =
       auVar102._16_4_ * auVar102._16_4_ +
       auVar10._16_4_ * auVar10._16_4_ + auVar58._16_4_ * auVar58._16_4_;
  auVar72._20_4_ =
       auVar102._20_4_ * auVar102._20_4_ +
       auVar10._20_4_ * auVar10._20_4_ + auVar58._20_4_ * auVar58._20_4_;
  auVar72._24_4_ =
       auVar102._24_4_ * auVar102._24_4_ +
       auVar10._24_4_ * auVar10._24_4_ + auVar58._24_4_ * auVar58._24_4_;
  auVar72._28_4_ = auVar57._28_4_ + auVar57._28_4_ + auVar56._28_4_;
  auVar12._4_4_ = fVar35 * fVar35;
  auVar12._0_4_ = fVar33 * fVar33;
  auVar12._8_4_ = fVar36 * fVar36;
  auVar12._12_4_ = fVar38 * fVar38;
  auVar12._16_4_ = fVar39 * fVar39;
  auVar12._20_4_ = fVar40 * fVar40;
  auVar12._24_4_ = fVar41 * fVar41;
  auVar12._28_4_ = fVar37 + auVar71._28_4_;
  auVar88 = vcmpps_avx(auVar72,auVar12,2);
  auVar55 = vpshufd_avx(ZEXT116(sphere->numPrimitives),0);
  auVar79._16_16_ = auVar55;
  auVar79._0_16_ = auVar55;
  auVar56 = vcvtdq2ps_avx(auVar79);
  auVar56 = vcmpps_avx(_DAT_01f7b060,auVar56,1);
  auVar57 = auVar56 & auVar88;
  if ((((((((auVar57 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar57 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar57 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar57 >> 0x7f,0) != '\0') ||
        (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar57 >> 0xbf,0) != '\0') ||
      (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar57[0x1f] < '\0') {
    auVar88 = vandps_avx(auVar88,auVar56);
    auVar56 = vsubps_avx(auVar12,auVar72);
    auVar14._4_4_ = fVar48 * auVar56._4_4_;
    auVar14._0_4_ = fVar42 * auVar56._0_4_;
    auVar14._8_4_ = fVar49 * auVar56._8_4_;
    auVar14._12_4_ = fVar50 * auVar56._12_4_;
    auVar14._16_4_ = fVar51 * auVar56._16_4_;
    auVar14._20_4_ = fVar52 * auVar56._20_4_;
    auVar14._24_4_ = fVar53 * auVar56._24_4_;
    auVar14._28_4_ = auVar56._28_4_;
    auVar12 = vsqrtps_avx(auVar14);
    auVar101 = ZEXT3264(auVar12);
    auVar13 = vsubps_avx(auVar11,auVar12);
    auVar95._0_4_ = auVar12._0_4_ + fVar54;
    auVar95._4_4_ = auVar12._4_4_ + fVar63;
    auVar95._8_4_ = auVar12._8_4_ + fVar64;
    auVar95._12_4_ = auVar12._12_4_ + fVar65;
    auVar95._16_4_ = auVar12._16_4_ + fVar66;
    auVar95._20_4_ = auVar12._20_4_ + fVar67;
    auVar95._24_4_ = auVar12._24_4_ + fVar68;
    auVar95._28_4_ = auVar12._28_4_ + fVar69;
    auVar96 = ZEXT3264(auVar95);
    auVar55 = vshufps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x30)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x30)),0);
    auVar46._16_16_ = auVar55;
    auVar46._0_16_ = auVar55;
    auVar56 = vcmpps_avx(auVar46,auVar13,2);
    uVar29 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar80._4_4_ = uVar29;
    auVar80._0_4_ = uVar29;
    auVar80._8_4_ = uVar29;
    auVar80._12_4_ = uVar29;
    auVar80._16_4_ = uVar29;
    auVar80._20_4_ = uVar29;
    auVar80._24_4_ = uVar29;
    auVar80._28_4_ = uVar29;
    auVar81 = ZEXT3264(auVar80);
    auVar71 = vcmpps_avx(auVar13,auVar80,2);
    auVar56 = vandps_avx(auVar71,auVar56);
    auVar56 = vandps_avx(auVar56,auVar88);
    auVar103 = ZEXT3264(auVar56);
    auVar57 = vcmpps_avx(auVar46,auVar95,2);
    auVar11 = vcmpps_avx(auVar95,auVar80,2);
    auVar57 = vandps_avx(auVar11,auVar57);
    local_300 = vandps_avx(auVar57,auVar88);
    auVar57 = vorps_avx(auVar56,local_300);
    if ((((((((auVar57 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar57 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar57 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar57 >> 0x7f,0) != '\0') ||
          (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar57 >> 0xbf,0) != '\0') ||
        (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar57[0x1f] < '\0')
    {
      local_200 = vblendvps_avx(auVar95,auVar13,auVar56);
      auVar61._0_8_ = auVar12._0_8_ ^ 0x8000000080000000;
      auVar61._8_4_ = -auVar12._8_4_;
      auVar61._12_4_ = -auVar12._12_4_;
      auVar61._16_4_ = -auVar12._16_4_;
      auVar61._20_4_ = -auVar12._20_4_;
      auVar61._24_4_ = -auVar12._24_4_;
      auVar61._28_4_ = -auVar12._28_4_;
      auVar56 = vblendvps_avx(auVar12,auVar61,auVar56);
      fVar9 = auVar56._0_4_;
      fVar54 = auVar56._4_4_;
      auVar15._4_4_ = fVar1 * fVar54;
      auVar15._0_4_ = fVar1 * fVar9;
      fVar34 = auVar56._8_4_;
      auVar15._8_4_ = fVar1 * fVar34;
      fVar33 = auVar56._12_4_;
      auVar15._12_4_ = fVar1 * fVar33;
      fVar35 = auVar56._16_4_;
      auVar15._16_4_ = fVar1 * fVar35;
      fVar41 = auVar56._20_4_;
      auVar15._20_4_ = fVar1 * fVar41;
      fVar36 = auVar56._24_4_;
      auVar15._24_4_ = fVar1 * fVar36;
      auVar15._28_4_ = auVar71._28_4_;
      auVar16._4_4_ = fVar7 * fVar54;
      auVar16._0_4_ = fVar7 * fVar9;
      auVar16._8_4_ = fVar7 * fVar34;
      auVar16._12_4_ = fVar7 * fVar33;
      auVar16._16_4_ = fVar7 * fVar35;
      auVar16._20_4_ = fVar7 * fVar41;
      auVar16._24_4_ = fVar7 * fVar36;
      auVar16._28_4_ = auVar88._28_4_;
      auVar17._4_4_ = fVar8 * fVar54;
      auVar17._0_4_ = fVar8 * fVar9;
      auVar17._8_4_ = fVar8 * fVar34;
      auVar17._12_4_ = fVar8 * fVar33;
      auVar17._16_4_ = fVar8 * fVar35;
      auVar17._20_4_ = fVar8 * fVar41;
      auVar17._24_4_ = fVar8 * fVar36;
      auVar17._28_4_ = auVar56._28_4_;
      local_1e0 = vsubps_avx(auVar15,auVar102);
      auVar73 = ZEXT3264(local_1e0);
      local_1c0 = vsubps_avx(auVar16,auVar10);
      local_1a0 = vsubps_avx(auVar17,auVar58);
      auVar62 = ZEXT3264(local_1a0);
      uVar29 = vmovmskps_avx(auVar57);
      uVar32 = CONCAT44((int)((ulong)lVar31 >> 0x20),uVar29);
      auVar84 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
      local_348 = pSVar23;
      local_340 = sphere;
      local_338 = ray;
      do {
        auVar88 = auVar86._0_32_;
        auVar90 = auVar92._0_28_;
        local_330.hit = (RTCHitN *)local_2b0;
        local_330.valid = (int *)local_360;
        auVar56 = auVar89._0_32_;
        auVar58 = auVar99._0_32_;
        auVar97 = auVar98._0_28_;
        auVar74 = auVar73._28_36_;
        auVar93 = auVar94._0_28_;
        auVar70 = auVar62._28_36_;
        auVar100 = auVar101._0_28_;
        auVar57 = auVar96._0_32_;
        auVar102 = auVar103._0_32_;
        uVar21 = 0;
        if (uVar32 != 0) {
          for (; (uVar32 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
          }
        }
        uVar2 = *(uint *)(local_220 + uVar21 * 4);
        pGVar3 = (pSVar23->geometries).items[uVar2].ptr;
        if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar27 = true, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
          goto LAB_00a7130d;
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_200 + uVar21 * 4);
          local_330.context = context->user;
          local_250 = vpshufd_avx(ZEXT416(uVar2),0);
          local_260 = (local_340->primIDs).field_0.i[uVar21];
          local_2b0._4_4_ = *(undefined4 *)(local_1e0 + uVar21 * 4);
          uVar29 = *(undefined4 *)(local_1c0 + uVar21 * 4);
          local_2a0._4_4_ = uVar29;
          local_2a0._0_4_ = uVar29;
          local_2a0._8_4_ = uVar29;
          local_2a0._12_4_ = uVar29;
          auVar73 = ZEXT1664(local_2a0);
          uVar29 = *(undefined4 *)(local_1a0 + uVar21 * 4);
          local_290._4_4_ = uVar29;
          local_290._0_4_ = uVar29;
          local_290._8_4_ = uVar29;
          local_290._12_4_ = uVar29;
          local_2b0._0_4_ = local_2b0._4_4_;
          local_2b0._8_4_ = local_2b0._4_4_;
          local_2b0._12_4_ = local_2b0._4_4_;
          local_280 = ZEXT432(0) << 0x20;
          auVar10 = vcmpps_avx(local_280,ZEXT432(0) << 0x20,0xf);
          auVar62 = ZEXT3264(auVar10);
          uStack_23c = (local_330.context)->instID[0];
          local_240 = uStack_23c;
          uStack_238 = uStack_23c;
          uStack_234 = uStack_23c;
          uStack_230 = (local_330.context)->instPrimID[0];
          uStack_22c = uStack_230;
          uStack_228 = uStack_230;
          uStack_224 = uStack_230;
          local_360 = *(undefined1 (*) [16])
                       (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
          local_330.geometryUserPtr = pGVar3->userPtr;
          local_330.N = 4;
          local_2e0 = auVar81._0_32_;
          local_80 = auVar92._0_32_;
          local_a0 = auVar94._0_32_;
          local_c0 = auVar98._0_32_;
          local_e0 = auVar58;
          local_100 = auVar88;
          local_120 = auVar56;
          local_140 = auVar57;
          local_160 = auVar101._0_32_;
          local_180 = auVar102;
          local_330.ray = (RTCRayN *)ray;
          uStack_25c = local_260;
          uStack_258 = local_260;
          uStack_254 = local_260;
          if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar62 = ZEXT1664(auVar10._0_16_);
            auVar73 = ZEXT1664(local_2a0);
            (*pGVar3->occlusionFilterN)(&local_330);
            auVar103 = ZEXT3264(local_180);
            auVar101 = ZEXT3264(local_160);
            auVar96 = ZEXT3264(local_140);
            auVar89 = ZEXT3264(local_120);
            auVar86 = ZEXT3264(local_100);
            auVar99 = ZEXT3264(local_e0);
            auVar98 = ZEXT3264(local_c0);
            auVar94 = ZEXT3264(local_a0);
            auVar92 = ZEXT3264(local_80);
            auVar84 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
            auVar81 = ZEXT3264(local_2e0);
            pSVar23 = local_348;
          }
          if (local_360 == (undefined1  [16])0x0) {
            auVar43 = ZEXT816(0);
            auVar55 = vpcmpeqd_avx((undefined1  [16])0x0,auVar43);
            auVar43 = vpcmpeqd_avx(auVar43,auVar43);
            auVar55 = auVar55 ^ auVar43;
          }
          else {
            p_Var6 = context->args->filter;
            auVar43 = ZEXT816(0);
            auVar55 = vpcmpeqd_avx(auVar62._0_16_,auVar62._0_16_);
            auVar62 = ZEXT1664(auVar55);
            if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
              auVar73 = ZEXT1664(auVar73._0_16_);
              (*p_Var6)(&local_330);
              auVar55 = vpcmpeqd_avx(auVar55,auVar55);
              auVar62 = ZEXT1664(auVar55);
              auVar43 = ZEXT816(0) << 0x40;
              auVar103 = ZEXT3264(local_180);
              auVar101 = ZEXT3264(local_160);
              auVar96 = ZEXT3264(local_140);
              auVar89 = ZEXT3264(local_120);
              auVar86 = ZEXT3264(local_100);
              auVar99 = ZEXT3264(local_e0);
              auVar98 = ZEXT3264(local_c0);
              auVar94 = ZEXT3264(local_a0);
              auVar92 = ZEXT3264(local_80);
              auVar84 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
              auVar81 = ZEXT3264(local_2e0);
              pSVar23 = local_348;
            }
            auVar43 = vpcmpeqd_avx(local_360,auVar43);
            auVar55 = auVar43 ^ auVar62._0_16_;
            auVar43 = vblendvps_avx(auVar84._0_16_,*(undefined1 (*) [16])(local_330.ray + 0x80),
                                    auVar43);
            *(undefined1 (*) [16])(local_330.ray + 0x80) = auVar43;
          }
          auVar88 = auVar86._0_32_;
          auVar90 = auVar92._0_28_;
          auVar56 = auVar89._0_32_;
          auVar58 = auVar99._0_32_;
          auVar97 = auVar98._0_28_;
          auVar74 = auVar73._28_36_;
          auVar93 = auVar94._0_28_;
          auVar70 = auVar62._28_36_;
          auVar100 = auVar101._0_28_;
          auVar57 = auVar96._0_32_;
          auVar102 = auVar103._0_32_;
          auVar43._8_8_ = 0x100000001;
          auVar43._0_8_ = 0x100000001;
          if ((auVar43 & auVar55) != (undefined1  [16])0x0) {
            auVar81 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
            bVar27 = true;
            goto LAB_00a7130d;
          }
          *(int *)(ray + k * 4 + 0x80) = auVar81._0_4_;
        }
        auVar88 = auVar86._0_32_;
        auVar90 = auVar92._0_28_;
        auVar56 = auVar89._0_32_;
        auVar58 = auVar99._0_32_;
        auVar97 = auVar98._0_28_;
        auVar74 = auVar73._28_36_;
        auVar93 = auVar94._0_28_;
        auVar70 = auVar62._28_36_;
        auVar100 = auVar101._0_28_;
        auVar57 = auVar96._0_32_;
        auVar102 = auVar103._0_32_;
        uVar32 = uVar32 ^ 1L << (uVar21 & 0x3f);
      } while (uVar32 != 0);
      bVar27 = false;
LAB_00a7130d:
      auVar102 = vandps_avx(auVar102,local_300);
      auVar55 = vshufps_avx(auVar81._0_16_,auVar81._0_16_,0);
      auVar47._16_16_ = auVar55;
      auVar47._0_16_ = auVar55;
      auVar10 = vcmpps_avx(auVar57,auVar47,2);
      auVar71 = auVar102 & auVar10;
      if ((((((((auVar71 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar71 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar71 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar71 >> 0x7f,0) == '\0') &&
            (auVar71 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar71 >> 0xbf,0) == '\0') &&
          (auVar71 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar71[0x1f])
      {
        return bVar27;
      }
      auVar102 = vandps_avx(auVar10,auVar102);
      fVar1 = auVar100._0_4_;
      fVar7 = auVar100._4_4_;
      auVar18._4_4_ = auVar90._4_4_ * fVar7;
      auVar18._0_4_ = auVar90._0_4_ * fVar1;
      fVar8 = auVar100._8_4_;
      auVar18._8_4_ = auVar90._8_4_ * fVar8;
      fVar9 = auVar100._12_4_;
      auVar18._12_4_ = auVar90._12_4_ * fVar9;
      fVar54 = auVar100._16_4_;
      auVar18._16_4_ = auVar90._16_4_ * fVar54;
      fVar34 = auVar100._20_4_;
      auVar18._20_4_ = auVar90._20_4_ * fVar34;
      fVar33 = auVar100._24_4_;
      auVar18._24_4_ = auVar90._24_4_ * fVar33;
      auVar18._28_4_ = auVar10._28_4_;
      auVar86._0_4_ = auVar93._0_4_ * fVar1;
      auVar86._4_4_ = auVar93._4_4_ * fVar7;
      auVar86._8_4_ = auVar93._8_4_ * fVar8;
      auVar86._12_4_ = auVar93._12_4_ * fVar9;
      auVar86._16_4_ = auVar93._16_4_ * fVar54;
      auVar86._20_4_ = auVar93._20_4_ * fVar34;
      auVar86._24_4_ = auVar93._24_4_ * fVar33;
      auVar86._28_36_ = auVar70;
      auVar89._0_4_ = auVar97._0_4_ * fVar1;
      auVar89._4_4_ = auVar97._4_4_ * fVar7;
      auVar89._8_4_ = auVar97._8_4_ * fVar8;
      auVar89._12_4_ = auVar97._12_4_ * fVar9;
      auVar89._16_4_ = auVar97._16_4_ * fVar54;
      auVar89._20_4_ = auVar97._20_4_ * fVar34;
      auVar89._24_4_ = auVar97._24_4_ * fVar33;
      auVar89._28_36_ = auVar74;
      local_1e0 = vsubps_avx(auVar18,auVar58);
      local_1c0 = vsubps_avx(auVar86._0_32_,auVar88);
      local_1a0 = vsubps_avx(auVar89._0_32_,auVar56);
      local_200 = auVar57;
      pSVar23 = context->scene;
      uVar29 = vmovmskps_avx(auVar102);
      uVar32 = CONCAT44((int)(uVar32 >> 0x20),uVar29);
      auVar88 = vcmpps_avx(auVar56,auVar56,0xf);
      auVar86 = ZEXT3264(auVar88);
      auVar89 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar55 = vpcmpeqd_avx(auVar93._0_16_,auVar93._0_16_);
      auVar92 = ZEXT1664(auVar55);
      do {
        local_330.hit = (RTCHitN *)local_2b0;
        local_330.valid = (int *)local_360;
        uVar21 = 0;
        if (uVar32 != 0) {
          for (; (uVar32 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
          }
        }
        uVar2 = *(uint *)(local_220 + uVar21 * 4);
        pGVar3 = (pSVar23->geometries).items[uVar2].ptr;
        if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar20 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00a71606;
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_200 + uVar21 * 4);
          local_330.context = context->user;
          local_250 = vpshufd_avx(ZEXT416(uVar2),0);
          local_260 = (local_340->primIDs).field_0.i[uVar21];
          uVar29 = *(undefined4 *)(local_1e0 + uVar21 * 4);
          local_2b0._4_4_ = uVar29;
          local_2b0._0_4_ = uVar29;
          local_2b0._8_4_ = uVar29;
          local_2b0._12_4_ = uVar29;
          uVar29 = *(undefined4 *)(local_1c0 + uVar21 * 4);
          local_2a0._4_4_ = uVar29;
          local_2a0._0_4_ = uVar29;
          local_2a0._8_4_ = uVar29;
          local_2a0._12_4_ = uVar29;
          uVar29 = *(undefined4 *)(local_1a0 + uVar21 * 4);
          local_290._4_4_ = uVar29;
          local_290._0_4_ = uVar29;
          local_290._8_4_ = uVar29;
          local_290._12_4_ = uVar29;
          local_280 = ZEXT1632(ZEXT816(0));
          uStack_23c = (local_330.context)->instID[0];
          local_240 = uStack_23c;
          uStack_238 = uStack_23c;
          uStack_234 = uStack_23c;
          uStack_230 = (local_330.context)->instPrimID[0];
          uStack_22c = uStack_230;
          uStack_228 = uStack_230;
          uStack_224 = uStack_230;
          local_360 = *(undefined1 (*) [16])
                       (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
          local_330.geometryUserPtr = pGVar3->userPtr;
          local_330.N = 4;
          local_2e0 = auVar81._0_32_;
          local_300._0_8_ = pSVar23;
          local_330.ray = (RTCRayN *)ray;
          uStack_25c = local_260;
          uStack_258 = local_260;
          uStack_254 = local_260;
          if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar88 = ZEXT1632(auVar86._0_16_);
            auVar55 = auVar92._0_16_;
            (*pGVar3->occlusionFilterN)(&local_330);
            auVar55 = vpcmpeqd_avx(auVar55,auVar55);
            auVar92 = ZEXT1664(auVar55);
            auVar89 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar88 = vcmpps_avx(auVar88,auVar88,0xf);
            auVar86 = ZEXT3264(auVar88);
            auVar84 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
            auVar81 = ZEXT3264(local_2e0);
            ray = local_338;
            pSVar23 = (Scene *)local_300._0_8_;
          }
          auVar55 = auVar92._0_16_;
          if (local_360 == (undefined1  [16])0x0) {
            auVar43 = vpcmpeqd_avx(auVar89._0_16_,(undefined1  [16])0x0);
            auVar55 = auVar55 ^ auVar43;
          }
          else {
            p_Var6 = context->args->filter;
            if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
              auVar88 = ZEXT1632(auVar86._0_16_);
              (*p_Var6)(&local_330);
              auVar55 = vpcmpeqd_avx(auVar55,auVar55);
              auVar92 = ZEXT1664(auVar55);
              auVar89 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar88 = vcmpps_avx(auVar88,auVar88,0xf);
              auVar86 = ZEXT3264(auVar88);
              auVar84 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
              auVar81 = ZEXT3264(local_2e0);
              pSVar23 = (Scene *)local_300._0_8_;
            }
            auVar43 = vpcmpeqd_avx(auVar89._0_16_,local_360);
            auVar55 = auVar92._0_16_ ^ auVar43;
            auVar43 = vblendvps_avx(auVar84._0_16_,*(undefined1 (*) [16])(local_330.ray + 0x80),
                                    auVar43);
            *(undefined1 (*) [16])(local_330.ray + 0x80) = auVar43;
          }
          auVar44._8_8_ = 0x100000001;
          auVar44._0_8_ = 0x100000001;
          if ((auVar44 & auVar55) != (undefined1  [16])0x0) {
            bVar20 = 1;
            goto LAB_00a71606;
          }
          *(int *)(ray + k * 4 + 0x80) = auVar81._0_4_;
        }
        uVar32 = uVar32 ^ 1L << (uVar21 & 0x3f);
        if (uVar32 == 0) {
          bVar20 = 0;
LAB_00a71606:
          return (bool)(bVar27 | bVar20);
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(
          const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& sphere)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom, ray.time()[k]);
        const vbool<M> valid = sphere.valid();
        return SphereIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Occluded1KEpilogM<M, K, filter>(ray, k, context, sphere.geomID(), sphere.primID()));
      }